

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::refill(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  Cell CVar1;
  pointer pbVar2;
  bool bVar3;
  Cell CVar4;
  uint uVar5;
  ulong uVar6;
  
  requireDStackAvailable(this,1,"REFILL");
  CVar1 = this->sourceid;
  CVar4 = dataSpaceAtCell(this,this->VarOffsetBlkAddress);
  if (CVar4 == 0) {
    if (((int)CVar1 < 0) ||
       (pbVar2 = (this->inputBufferStrings).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
       uVar6 = this->inputBufferStringsCurrent + 1, this->inputBufferStringsCurrent = uVar6,
       (ulong)((long)pbVar2 -
               (long)(this->inputBufferStrings).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar6)) {
      uVar5 = this->False;
    }
    else {
      bVar3 = setSourceBuffer(this);
      if (bVar3) {
        uVar5 = this->True;
      }
      else {
        uVar5 = this->False;
      }
    }
  }
  else {
    this_00 = &this->dStack;
    ForthStack<unsigned_int>::push(this_00,CVar4 + 1);
    block(this);
    uVar5 = ForthStack<unsigned_int>::getTop(this_00);
    ForthStack<unsigned_int>::pop(this_00);
    this->sourceid = 0;
    setDataCell(this,this->VarOffsetBlkAddress,CVar4 + 1);
    setSourceVariables(this,uVar5,0x400,0);
    uVar5 = this->True;
  }
  ForthStack<unsigned_int>::push(&this->dStack,uVar5);
  return;
}

Assistant:

void refill() { 
			REQUIRE_DSTACK_AVAILABLE(1, "REFILL");
			auto sourceid_ = getSourceId();
			auto blk=getDataCell(VarOffsetBlkAddress);
			if (blk > 0) {
				++blk;
				dStack.push(blk);
				block();
				auto address=dStack.getTop();pop();
				setSourceId(0);
				setDataCell(VarOffsetBlkAddress, Cell(blk)); // set BLK=u
				setSourceVariables(address, 1024, 0);
				push(True);
			}
			else {
				if (sourceid_ >= 0) { // if input from file or from input buffer
					inputBufferStringsCurrent++;
					if (inputBufferStringsCurrent < inputBufferStrings.size()) {
						if (setSourceBuffer()) {
							push(True);
						}
						else {
							push(False);
						}
					}
					else {
						push(False);
					}
				}
				else {
					push(False); // input from EVALUATE
				}
			}
		}